

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementAnimation.cpp
# Opt level: O1

float __thiscall
Rml::ElementAnimation::GetInterpolationFactorAndKeys
          (ElementAnimation *this,int *out_key0,int *out_key1)

{
  code *pcVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  pointer pAVar5;
  ulong uVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  fVar8 = this->time_since_iteration_start;
  if (this->reverse_direction != false) {
    fVar8 = this->duration - fVar8;
  }
  pAVar5 = (this->keys).super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar4 = (int)((long)(this->keys).
                      super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pAVar5 >> 3) * -0x3b13b13b;
  iVar7 = -1;
  if (0 < (int)uVar4) {
    uVar6 = 0;
    do {
      if (fVar8 <= pAVar5->time) {
        iVar7 = (int)uVar6;
        break;
      }
      uVar6 = uVar6 + 1;
      pAVar5 = pAVar5 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar6);
  }
  iVar2 = uVar4 - 1;
  if (-1 < iVar7) {
    iVar2 = iVar7;
  }
  iVar7 = iVar2 + -1;
  if (iVar2 == 0) {
    iVar7 = 0;
  }
  if (((((iVar7 < 0) || ((int)uVar4 <= iVar2)) || (iVar2 < 0)) || ((int)uVar4 <= iVar7)) &&
     (bVar3 = Assert("RMLUI_ASSERT(key0 >= 0 && key0 < (int)keys.size() && key1 >= 0 && key1 < (int)keys.size())"
                     ,
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementAnimation.cpp"
                     ,0x2e3), !bVar3)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  pAVar5 = (this->keys).super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
           _M_impl.super__Vector_impl_data._M_start;
  fVar9 = pAVar5[iVar7].time;
  pAVar5 = pAVar5 + iVar2;
  fVar10 = pAVar5->time - fVar9;
  fVar9 = (float)(-(uint)(0.001 < fVar10) & (uint)((fVar8 - fVar9) / fVar10));
  fVar8 = 1.0;
  if (fVar9 <= 1.0) {
    fVar8 = fVar9;
  }
  fVar8 = Tween::operator()(&pAVar5->tween,(float)(~-(uint)(fVar9 < 0.0) & (uint)fVar8));
  if (out_key0 != (int *)0x0) {
    *out_key0 = iVar7;
  }
  if (out_key1 != (int *)0x0) {
    *out_key1 = iVar2;
  }
  return fVar8;
}

Assistant:

float ElementAnimation::GetInterpolationFactorAndKeys(int* out_key0, int* out_key1) const
{
	float t = time_since_iteration_start;

	if (reverse_direction)
		t = duration - t;

	int key0 = -1;
	int key1 = -1;

	{
		for (int i = 0; i < (int)keys.size(); i++)
		{
			if (keys[i].time >= t)
			{
				key1 = i;
				break;
			}
		}

		if (key1 < 0)
			key1 = (int)keys.size() - 1;
		key0 = (key1 == 0 ? 0 : key1 - 1);
	}

	RMLUI_ASSERT(key0 >= 0 && key0 < (int)keys.size() && key1 >= 0 && key1 < (int)keys.size());

	float alpha = 0.0f;

	{
		const float t0 = keys[key0].time;
		const float t1 = keys[key1].time;

		const float eps = 1e-3f;

		if (t1 - t0 > eps)
			alpha = (t - t0) / (t1 - t0);

		alpha = Math::Clamp(alpha, 0.0f, 1.0f);
	}

	alpha = keys[key1].tween(alpha);

	if (out_key0)
		*out_key0 = key0;
	if (out_key1)
		*out_key1 = key1;

	return alpha;
}